

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# all_catcher_test.cpp
# Opt level: O2

void __thiscall
AllCatcher_Tests::Test_that_all_catcher_with_differnt_fail_code_types_works::test_method
          (Test_that_all_catcher_with_differnt_fail_code_types_works *this)

{
  GenericExceptionHandler<void,_mittens::UnHandler<bool>,_mittens::DefaultNoAction<void>_> catcher;
  
  throw_int(0);
  throw_int(0);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(Test_that_all_catcher_with_differnt_fail_code_types_works)
{
   {
      auto catcher = all_catcher(false); // use bool fail code type

      try
      {
         throw_int();
      }
      catch (...)
      {
         BOOST_CHECK_EQUAL(false, catcher.handleException());
      }
   }

   {
      auto catcher = all_catcher(0.7); // use float fail code type

      try
      {
         throw_int();
      }
      catch (...)
      {
         BOOST_CHECK_EQUAL(0.7, catcher.handleException());
      }
   }
}